

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JCOEF JVar1;
  uint uVar2;
  uint uVar3;
  jpeg_c_coef_controller *pjVar4;
  forward_DCT_ptr p_Var5;
  uint uVar6;
  boolean bVar7;
  JBLOCKARRAY ppaJVar8;
  ulong uVar9;
  jpeg_component_info *pjVar10;
  size_t sVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  jpeg_component_info *pjVar16;
  jpeg_component_info *input_buf_00;
  ulong uVar17;
  long lVar18;
  JBLOCKROW __s;
  jpeg_component_info *pjVar19;
  JBLOCKROW paJVar20;
  int local_80;
  
  pjVar4 = cinfo->coef;
  uVar6 = cinfo->total_iMCU_rows - 1;
  pjVar16 = cinfo->comp_info;
  input_buf_00 = (jpeg_component_info *)input_buf;
  for (lVar18 = 0; lVar18 < cinfo->num_components; lVar18 = lVar18 + 1) {
    ppaJVar8 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,(jvirt_barray_ptr)(&pjVar4[7].start_pass)[lVar18],
                          *(int *)&pjVar4[1].start_pass * pjVar16->v_samp_factor,
                          pjVar16->v_samp_factor,1);
    if (*(uint *)&pjVar4[1].start_pass < uVar6) {
      input_buf_00 = (jpeg_component_info *)(ulong)(uint)pjVar16->v_samp_factor;
    }
    else {
      input_buf_00 = (jpeg_component_info *)
                     ((ulong)pjVar16->height_in_blocks % (ulong)(uint)pjVar16->v_samp_factor);
      if ((int)input_buf_00 == 0) {
        input_buf_00 = (jpeg_component_info *)(ulong)(uint)pjVar16->v_samp_factor;
      }
    }
    uVar2 = pjVar16->width_in_blocks;
    uVar9 = (ulong)uVar2;
    uVar3 = pjVar16->h_samp_factor;
    iVar13 = (int)(uVar9 % (ulong)uVar3);
    uVar17 = (ulong)(uVar3 - iVar13);
    if (iVar13 < 1) {
      uVar17 = uVar9 % (ulong)uVar3;
    }
    p_Var5 = cinfo->fdct->forward_DCT[lVar18];
    iVar13 = (int)input_buf_00;
    pjVar10 = (jpeg_component_info *)0x0;
    if (0 < iVar13) {
      pjVar10 = input_buf_00;
    }
    for (pjVar19 = (jpeg_component_info *)0x0; local_80 = (int)uVar17, pjVar19 != pjVar10;
        pjVar19 = (jpeg_component_info *)((long)&pjVar19->component_id + 1)) {
      paJVar20 = ppaJVar8[(long)pjVar19];
      input_buf_00 = pjVar16;
      (*p_Var5)(cinfo,pjVar16,input_buf[lVar18],paJVar20,pjVar16->DCT_v_scaled_size * (int)pjVar19,0
                ,uVar2);
      if (0 < local_80) {
        input_buf_00 = (jpeg_component_info *)0x0;
        memset(paJVar20 + uVar9,0,uVar17 * 0x80);
        JVar1 = paJVar20[uVar9 - 1][0];
        for (sVar11 = 0; uVar17 * 0x80 != sVar11; sVar11 = sVar11 + 0x80) {
          *(JCOEF *)((long)paJVar20[uVar9] + sVar11) = JVar1;
        }
      }
    }
    if (*(uint *)&pjVar4[1].start_pass == uVar6) {
      uVar17 = 0;
      if (0 < (int)uVar3) {
        uVar17 = (ulong)uVar3;
      }
      for (lVar14 = (long)iVar13; lVar14 < pjVar16->v_samp_factor; lVar14 = lVar14 + 1) {
        paJVar20 = ppaJVar8[lVar14 + -1];
        __s = ppaJVar8[lVar14];
        input_buf_00 = (jpeg_component_info *)0x0;
        memset(__s,0,(ulong)(local_80 + uVar2) << 7);
        for (uVar15 = 0; uVar15 < (local_80 + uVar2) / uVar3; uVar15 = uVar15 + 1) {
          JVar1 = paJVar20[(long)(int)uVar3 + -1][0];
          for (lVar12 = 0; uVar17 * 0x80 != lVar12; lVar12 = lVar12 + 0x80) {
            *(JCOEF *)((long)*__s + lVar12) = JVar1;
          }
          paJVar20 = paJVar20 + (int)uVar3;
          __s = __s + (int)uVar3;
        }
      }
    }
    pjVar16 = pjVar16 + 1;
  }
  bVar7 = compress_output(cinfo,(JSAMPIMAGE)input_buf_00);
  return bVar7;
}

Assistant:

METHODDEF(boolean)
compress_first_pass (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;
  forward_DCT_ptr forward_DCT;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int) (blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    forward_DCT = cinfo->fdct->forward_DCT[ci];
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*forward_DCT) (cinfo, compptr, input_buf[ci], thisblockrow,
		      (JDIMENSION) (block_row * compptr->DCT_v_scaled_size),
		      (JDIMENSION) 0, blocks_across);
      if (ndummy > 0) {
	/* Create dummy blocks at the right edge of the image. */
	thisblockrow += blocks_across; /* => first dummy block */
	FMEMZERO((void FAR *) thisblockrow, ndummy * SIZEOF(JBLOCK));
	lastDC = thisblockrow[-1][0];
	for (bi = 0; bi < ndummy; bi++) {
	  thisblockrow[bi][0] = lastDC;
	}
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;	/* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
	   block_row++) {
	thisblockrow = buffer[block_row];
	lastblockrow = buffer[block_row-1];
	FMEMZERO((void FAR *) thisblockrow,
		 (size_t) (blocks_across * SIZEOF(JBLOCK)));
	for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
	  lastDC = lastblockrow[h_samp_factor-1][0];
	  for (bi = 0; bi < h_samp_factor; bi++) {
	    thisblockrow[bi][0] = lastDC;
	  }
	  thisblockrow += h_samp_factor; /* advance to next MCU in row */
	  lastblockrow += h_samp_factor;
	}
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}